

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O1

int nghttp2_check_method(uint8_t *value,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  if (len != 0) {
    sVar2 = 0;
    do {
      if (""[value[sVar2]] == '\0') {
        return 0;
      }
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int nghttp2_check_method(const uint8_t *value, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  for (last = value + len; value != last; ++value) {
    if (!VALID_METHOD_CHARS[*value]) {
      return 0;
    }
  }
  return 1;
}